

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssh_fixture.c
# Opt level: O2

libssh2_socket_t open_socket_to_openssh_server(void)

{
  int iVar1;
  in_addr_t iVar2;
  char *pcVar3;
  char *pcVar4;
  long lVar5;
  uint uVar6;
  int iVar7;
  uint uVar8;
  bool bVar9;
  char *ip_address;
  char *port_string;
  sockaddr local_40;
  
  pcVar4 = running_container_id;
  ip_address = (char *)0x0;
  port_string = (char *)0x0;
  if (have_docker == 0) {
    pcVar3 = getenv("OPENSSH_SERVER_HOST");
    pcVar4 = "127.0.0.1";
    if (pcVar3 != (char *)0x0) {
      pcVar4 = pcVar3;
    }
    ip_address = strdup(pcVar4);
    pcVar3 = openssh_server_port();
    pcVar4 = "4711";
    if (pcVar3 != (char *)0x0) {
      pcVar4 = pcVar3;
    }
LAB_00103049:
    port_string = strdup(pcVar4);
LAB_00103073:
    pcVar4 = ip_address;
    if (ip_address == (char *)0x0) {
      pcVar4 = (char *)0x0;
    }
    else {
      iVar7 = strcmp(ip_address,"0.0.0.0");
      if (iVar7 == 0) {
        free(pcVar4);
        pcVar4 = strdup("127.0.0.1");
        ip_address = pcVar4;
      }
    }
    iVar2 = inet_addr(pcVar4);
    if (iVar2 == 0xffffffff) {
      pcVar3 = "Failed to convert %s host address\n";
      pcVar4 = ip_address;
      goto LAB_001031da;
    }
    uVar6 = 1;
    iVar7 = socket(2,1,0);
    if (iVar7 == -1) {
      iVar7 = -1;
      fprintf(_stderr,"Failed to open socket (%d)\n",0xffffffff);
      goto LAB_001031e4;
    }
    local_40.sa_family = 2;
    lVar5 = strtol(port_string,(char **)0x0,0);
    local_40.sa_data._0_2_ = (ushort)lVar5 << 8 | (ushort)lVar5 >> 8;
    local_40.sa_data._2_4_ = iVar2;
    for (uVar8 = 0; uVar8 != 3; uVar8 = uVar8 + 1) {
      iVar1 = connect(iVar7,&local_40,0x10);
      if (iVar1 == 0) goto LAB_001031e4;
      fprintf(_stderr,"Connection to %s:%s attempt #%d failed: retrying...\n",ip_address,port_string
              ,(ulong)uVar8);
      sleep(uVar6);
      uVar6 = uVar6 + 2;
    }
    fprintf(_stderr,"Failed to connect to %s:%s\n",ip_address,port_string);
  }
  else {
    pcVar3 = getenv("DOCKER_MACHINE_NAME");
    if (pcVar3 != (char *)0x0) {
      uVar6 = 500;
      iVar7 = 6;
      while (iVar1 = run_command(&ip_address,"docker-machine ip %s",pcVar3), iVar1 != 0) {
        bVar9 = iVar7 == 0;
        iVar7 = iVar7 + -1;
        if (bVar9) {
          fprintf(_stderr,"Unable to get IP from docker-machine after %d attempts\n",6);
          goto LAB_001031b3;
        }
        sleep(uVar6);
        uVar6 = uVar6 * 2;
      }
LAB_00103039:
      iVar7 = is_running_inside_a_container();
      if (iVar7 != 0) {
        pcVar4 = "22";
        goto LAB_00103049;
      }
      iVar7 = run_command(&port_string,
                          "docker inspect --format \"{{ index (index (index .NetworkSettings.Ports \\\"22/tcp\\\") 0) \\\"HostPort\\\" }}\" %s"
                          ,pcVar4);
      if (iVar7 != 0) {
        pcVar3 = "Failed to get port for container %s\n";
        goto LAB_001031da;
      }
      goto LAB_00103073;
    }
    iVar7 = is_running_inside_a_container();
    pcVar3 = "docker inspect --format \"{{ .NetworkSettings.IPAddress }}\" %s";
    if (iVar7 == 0) {
      pcVar3 = 
      "docker inspect --format \"{{ index (index (index .NetworkSettings.Ports \\\"22/tcp\\\") 0) \\\"HostIp\\\" }}\" %s"
      ;
    }
    iVar7 = run_command(&ip_address,pcVar3,pcVar4);
    if (iVar7 == 0) goto LAB_00103039;
LAB_001031b3:
    pcVar3 = "Failed to get IP address for container %s\n";
LAB_001031da:
    fprintf(_stderr,pcVar3,pcVar4);
  }
  iVar7 = -1;
LAB_001031e4:
  free(ip_address);
  free(port_string);
  return iVar7;
}

Assistant:

static libssh2_socket_t open_socket_to_container(char *container_id)
{
    char *ip_address = NULL;
    char *port_string = NULL;
    uint32_t hostaddr;
    libssh2_socket_t sock;
    struct sockaddr_in sin;
    unsigned int counter;
    libssh2_socket_t ret = LIBSSH2_INVALID_SOCKET;

    if(have_docker) {
        int res;
        res = ip_address_from_container(container_id, &ip_address);
        if(res) {
            fprintf(stderr, "Failed to get IP address for container %s\n",
                    container_id);
            goto cleanup;
        }

        res = port_from_container(container_id, &port_string);
        if(res) {
            fprintf(stderr, "Failed to get port for container %s\n",
                    container_id);
            goto cleanup;
        }
    }
    else {
        const char *env;
        env = getenv("OPENSSH_SERVER_HOST");
        if(!env) {
            env = "127.0.0.1";
        }
        ip_address = strdup(env);
        env = openssh_server_port();
        if(!env) {
            env = "4711";
        }
        port_string = strdup(env);
    }

    /* 0.0.0.0 is returned by Docker for Windows, because the container
       is reachable from anywhere. But we cannot connect to 0.0.0.0,
       instead we assume localhost and try to connect to 127.0.0.1. */
    if(ip_address && strcmp(ip_address, "0.0.0.0") == 0) {
        free(ip_address);
        ip_address = strdup("127.0.0.1");
    }

    hostaddr = inet_addr(ip_address);
    if(hostaddr == (uint32_t)(-1)) {
        fprintf(stderr, "Failed to convert %s host address\n", ip_address);
        goto cleanup;
    }

    sock = socket(AF_INET, SOCK_STREAM, 0);
    if(sock == LIBSSH2_INVALID_SOCKET) {
        fprintf(stderr,
                "Failed to open socket (" LIBSSH2_SOCKET_MASK ")\n", sock);
        goto cleanup;
    }

    sin.sin_family = AF_INET;
    sin.sin_port = htons((unsigned short)strtol(port_string, NULL, 0));
    sin.sin_addr.s_addr = hostaddr;

    for(counter = 0; counter < 3; ++counter) {
        if(connect(sock, (struct sockaddr*)(&sin),
                   sizeof(struct sockaddr_in))) {
            fprintf(stderr,
                    "Connection to %s:%s attempt #%d failed: retrying...\n",
                    ip_address, port_string, counter);
            portable_sleep(1 + 2*counter);
        }
        else {
            ret = sock;
            break;
        }
    }
    if(ret == LIBSSH2_INVALID_SOCKET) {
        fprintf(stderr, "Failed to connect to %s:%s\n",
                ip_address, port_string);
        goto cleanup;
    }

cleanup:
    free(ip_address);
    free(port_string);

    return ret;
}